

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

void Vta_ManCollectNodes_rec(Vta_Man_t *p,Vta_Obj_t *pThis,Vec_Int_t *vOrder)

{
  uint uVar1;
  int iVar2;
  Vta_Obj_t *pVVar3;
  Vta_Obj_t *pThis1;
  Vta_Obj_t *pThis0;
  Vta_Obj_t *local_30;
  Vta_Obj_t *local_28;
  
  uVar1 = *(uint *)&pThis->field_0xc;
  if ((int)uVar1 < 0) {
    return;
  }
  *(uint *)&pThis->field_0xc = uVar1 | 0x80000000;
  iVar2 = pThis->iObj;
  if ((-1 < (long)iVar2) && (iVar2 < p->pGia->nObjs)) {
    if (0x3fffffff < uVar1) {
      Vta_ObjPreds(p,pThis,p->pGia->pObjs + iVar2,&local_28,&local_30);
      if (local_28 != (Vta_Obj_t *)0x0) {
        Vta_ManCollectNodes_rec(p,local_28,vOrder);
      }
      if (local_30 != (Vta_Obj_t *)0x0) {
        Vta_ManCollectNodes_rec(p,local_30,vOrder);
      }
    }
    pVVar3 = p->pObjs;
    if ((pVVar3 < pThis) && (pThis < pVVar3 + p->nObjs)) {
      Vec_IntPush(vOrder,(int)((ulong)((long)pThis - (long)pVVar3) >> 4));
      return;
    }
    __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x69,"int Vta_ObjId(Vta_Man_t *, Vta_Obj_t *)");
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Vta_ManCollectNodes_rec( Vta_Man_t * p, Vta_Obj_t * pThis, Vec_Int_t * vOrder )
{
    Gia_Obj_t * pObj;
    Vta_Obj_t * pThis0, * pThis1;
    if ( pThis->fVisit )
        return;
    pThis->fVisit = 1;
    pObj = Gia_ManObj( p->pGia, pThis->iObj );
    if ( pThis->fAdded )
    {
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( pThis0 ) Vta_ManCollectNodes_rec( p, pThis0, vOrder );
        if ( pThis1 ) Vta_ManCollectNodes_rec( p, pThis1, vOrder );
    }
    Vec_IntPush( vOrder, Vta_ObjId(p, pThis) );
}